

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::handleUnsupportedType(Dumper *this,Slice slice)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Exception *this_00;
  undefined8 *in_RDI;
  ExceptionType in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_30 [48];
  
  if (*(int *)*in_RDI == 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"null",4);
  }
  else {
    if (*(int *)*in_RDI != 1) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,in_stack_ffffffffffffff4c);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    plVar1 = (long *)in_RDI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::typeName
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x11af3f);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff50);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff50);
    (**(code **)(*plVar1 + 0x28))(plVar1,local_30);
    std::__cxx11::string::~string(in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  }
  return;
}

Assistant:

void Dumper::handleUnsupportedType(Slice slice) {
  if (options->unsupportedTypeBehavior == Options::NullifyUnsupportedType) {
    _sink->append("null", 4);
    return;
  } else if (options->unsupportedTypeBehavior ==
             Options::ConvertUnsupportedType) {
    _sink->append(std::string("\"(non-representable type ") + slice.typeName() +
                  ")\"");
    return;
  }

  throw Exception(Exception::NoJsonEquivalent);
}